

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O2

PeerRef __thiscall
anon_unknown.dwarf_1ccb39::PeerManagerImpl::GetPeerRef(PeerManagerImpl *this,NodeId id)

{
  long lVar1;
  long *plVar2;
  long in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long lVar3;
  long in_FS_OFFSET;
  PeerRef PVar4;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock31;
  unique_lock<std::mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&local_30,
             (AnnotatedMixin<std::mutex> *)(id + 0x218),"m_peer_mutex",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
             ,0x73d,false);
  plVar2 = (long *)(id + 0x250);
  lVar3 = id + 0x248;
  while (lVar1 = *plVar2, lVar1 != 0) {
    if (in_RDX <= *(long *)(lVar1 + 0x20)) {
      lVar3 = lVar1;
    }
    plVar2 = (long *)(lVar1 + (ulong)(*(long *)(lVar1 + 0x20) < in_RDX) * 8 + 0x10);
  }
  if ((lVar3 == id + 0x248) || (in_RDX < *(long *)(lVar3 + 0x20))) {
    (this->super_PeerManager).super_CValidationInterface._vptr_CValidationInterface =
         (_func_int **)0x0;
    (this->super_PeerManager).super_NetEventsInterface._vptr_NetEventsInterface = (_func_int **)0x0;
  }
  else {
    std::shared_ptr<(anonymous_namespace)::Peer>::shared_ptr
              ((shared_ptr<(anonymous_namespace)::Peer> *)this,
               (shared_ptr<(anonymous_namespace)::Peer> *)(lVar3 + 0x28));
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    PVar4.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = extraout_RDX._M_pi;
    PVar4.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (PeerRef)PVar4.
                    super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>;
  }
  __stack_chk_fail();
}

Assistant:

PeerRef PeerManagerImpl::GetPeerRef(NodeId id) const
{
    LOCK(m_peer_mutex);
    auto it = m_peer_map.find(id);
    return it != m_peer_map.end() ? it->second : nullptr;
}